

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O3

wchar_t tty_rawmode(EditLine *el)

{
  termios *t;
  termios *__termios_p;
  uchar (*s) [25];
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  wchar_t wVar4;
  speed_t sVar5;
  wchar_t wVar6;
  speed_t __speed;
  long lVar7;
  termios *ptVar8;
  uint *puVar9;
  
  if ((byte)((el->el_tty).t_mode - 1) < 2) {
    return L'\0';
  }
  if ((el->el_flags & L'\x04') != L'\0') {
    return L'\0';
  }
  t = &(el->el_tty).t_ts;
  wVar4 = tty_getty(el,t);
  wVar6 = L'\xffffffff';
  if (wVar4 == L'\xffffffff') {
    return L'\xffffffff';
  }
  (el->el_tty).t_eight = (uint)((~(el->el_tty).t_ts.c_cflag & 0x30) == 0);
  sVar5 = cfgetispeed((termios *)t);
  if (sVar5 == 0) {
    sVar5 = cfgetospeed((termios *)t);
  }
  (el->el_tty).t_speed = sVar5;
  __termios_p = &(el->el_tty).t_ex;
  sVar5 = cfgetispeed((termios *)__termios_p);
  if (sVar5 == 0) {
    sVar5 = cfgetospeed((termios *)__termios_p);
  }
  __speed = (el->el_tty).t_speed;
  if (sVar5 == __speed) {
    ptVar8 = &(el->el_tty).t_ed;
    sVar5 = cfgetispeed((termios *)ptVar8);
    if (sVar5 == 0) {
      sVar5 = cfgetospeed((termios *)ptVar8);
    }
    __speed = (el->el_tty).t_speed;
    if (sVar5 == __speed) goto LAB_00112c55;
  }
  cfsetispeed((termios *)__termios_p,__speed);
  cfsetospeed((termios *)__termios_p,(el->el_tty).t_speed);
  ptVar8 = &(el->el_tty).t_ed;
  cfsetispeed((termios *)ptVar8,(el->el_tty).t_speed);
  cfsetospeed((termios *)ptVar8,(el->el_tty).t_speed);
LAB_00112c55:
  if (((el->el_tty).t_ts.c_lflag & 2) != 0) {
    lVar7 = 0;
    do {
      uVar2 = (el->el_tty).t_ts.c_iflag;
      if (uVar2 != (el->el_tty).t_ex.c_iflag) {
        ptVar8 = &(el->el_tty).t_ed;
        if (lVar7 == 0x20) {
          if (uVar2 == ptVar8->c_iflag) goto LAB_00112d59;
          ptVar8->c_iflag =
               ~(el->el_tty).t_t[1][2].t_clrmask & uVar2 | (el->el_tty).t_t[1][2].t_setmask;
          uVar3 = (el->el_tty).t_t[0][2].t_clrmask;
          puVar9 = &(el->el_tty).t_t[0][2].t_setmask;
        }
        else {
          puVar9 = (uint *)((long)&(el->el_tty).t_t[0][0].t_setmask + lVar7);
          ptVar8->c_iflag =
               ~*(uint *)((long)&(el->el_tty).t_t[1][0].t_clrmask + lVar7) & uVar2 |
               *(uint *)((long)&(el->el_tty).t_t[1][0].t_setmask + lVar7);
          uVar3 = *(uint *)((long)&(el->el_tty).t_t[0][0].t_clrmask + lVar7);
        }
        (el->el_tty).t_ex.c_iflag = ~uVar3 & uVar2 | *puVar9;
      }
LAB_00112d59:
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x40);
    wVar4 = L'\0';
    if ((~(el->el_tty).t_ex.c_oflag & 0x1800) != 0) {
      wVar4 = (uint)(el->el_terminal).t_flags >> 3 & 1;
    }
    (el->el_tty).t_tabs = wVar4;
    s = (el->el_tty).t_c;
    tty__getchar(t,(el->el_tty).t_c[2]);
    lVar7 = -0x19;
    do {
      if ((el->el_tty).t_or.c_cc[lVar7 + -0x12] != (el->el_tty).t_c[1][lVar7]) {
        if (lVar7 != 0) {
          uVar2 = (el->el_tty).t_t[1][4].t_setmask;
          uVar3 = (el->el_tty).t_t[1][4].t_clrmask;
          lVar7 = 0;
          do {
            if (((uVar2 >> ((uint)lVar7 & 0x1f) & 1) == 0) &&
               (uVar1 = (el->el_tty).t_c[2][lVar7], uVar1 != (el->el_tty).t_c[0][lVar7])) {
              (el->el_tty).t_c[1][lVar7] = uVar1;
            }
            if ((uVar3 & 1 << ((byte)lVar7 & 0x1f)) != 0) {
              (el->el_tty).t_c[1][lVar7] = (el->el_tty).t_vdisable;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0x19);
          lVar7 = 0;
          tty_bind_char(el,L'\0');
          tty__setchar(&(el->el_tty).t_ed,(el->el_tty).t_c[1]);
          uVar2 = (el->el_tty).t_t[0][4].t_setmask;
          uVar3 = (el->el_tty).t_t[0][4].t_clrmask;
          do {
            if (((uVar2 >> ((uint)lVar7 & 0x1f) & 1) == 0) &&
               (uVar1 = (el->el_tty).t_c[2][lVar7], uVar1 != (*s)[lVar7])) {
              (*s)[lVar7] = uVar1;
            }
            if ((uVar3 & 1 << ((byte)lVar7 & 0x1f)) != 0) {
              (el->el_tty).t_c[0][lVar7] = (el->el_tty).t_vdisable;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != 0x19);
          tty__setchar(__termios_p,*s);
        }
        break;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0);
  }
  wVar4 = tty_setty(el,L'\x01',&(el->el_tty).t_ed);
  if (wVar4 != L'\xffffffff') {
    (el->el_tty).t_mode = '\x01';
    wVar6 = L'\0';
  }
  return wVar6;
}

Assistant:

libedit_private int
tty_rawmode(EditLine *el)
{

	if (el->el_tty.t_mode == ED_IO || el->el_tty.t_mode == QU_IO)
		return 0;

	if (el->el_flags & EDIT_DISABLED)
		return 0;

	if (tty_getty(el, &el->el_tty.t_ts) == -1) {
#ifdef DEBUG_TTY
		(void) fprintf(el->el_errfile, "%s: tty_getty: %s\n", __func__,
		    strerror(errno));
#endif /* DEBUG_TTY */
		return -1;
	}
	/*
         * We always keep up with the eight bit setting and the speed of the
         * tty. But we only believe changes that are made to cooked mode!
         */
	el->el_tty.t_eight = tty__geteightbit(&el->el_tty.t_ts);
	el->el_tty.t_speed = tty__getspeed(&el->el_tty.t_ts);

	if (tty__getspeed(&el->el_tty.t_ex) != el->el_tty.t_speed ||
	    tty__getspeed(&el->el_tty.t_ed) != el->el_tty.t_speed) {
		(void) cfsetispeed(&el->el_tty.t_ex, el->el_tty.t_speed);
		(void) cfsetospeed(&el->el_tty.t_ex, el->el_tty.t_speed);
		(void) cfsetispeed(&el->el_tty.t_ed, el->el_tty.t_speed);
		(void) cfsetospeed(&el->el_tty.t_ed, el->el_tty.t_speed);
	}
	if (tty__cooked_mode(&el->el_tty.t_ts)) {
		int i;

		for (i = MD_INP; i <= MD_LIN; i++)
			tty_update_flags(el, i);

		if (tty__gettabs(&el->el_tty.t_ex) == 0)
			el->el_tty.t_tabs = 0;
		else
			el->el_tty.t_tabs = EL_CAN_TAB ? 1 : 0;

		tty__getchar(&el->el_tty.t_ts, el->el_tty.t_c[TS_IO]);
		/*
		 * Check if the user made any changes.
		 * If he did, then propagate the changes to the
		 * edit and execute data structures.
		 */
		for (i = 0; i < C_NCC; i++)
			if (el->el_tty.t_c[TS_IO][i] !=
			    el->el_tty.t_c[EX_IO][i])
				break;

		if (i != C_NCC) {
			/*
			 * Propagate changes only to the unlibedit_private
			 * chars that have been modified just now.
			 */
			for (i = 0; i < C_NCC; i++)
				tty_update_char(el, ED_IO, i);

			tty_bind_char(el, 0);
			tty__setchar(&el->el_tty.t_ed, el->el_tty.t_c[ED_IO]);

			for (i = 0; i < C_NCC; i++)
				tty_update_char(el, EX_IO, i);

			tty__setchar(&el->el_tty.t_ex, el->el_tty.t_c[EX_IO]);
		}
	}
	if (tty_setty(el, TCSADRAIN, &el->el_tty.t_ed) == -1) {
#ifdef DEBUG_TTY
		(void) fprintf(el->el_errfile, "%s: tty_setty: %s\n", __func__,
		    strerror(errno));
#endif /* DEBUG_TTY */
		return -1;
	}
	el->el_tty.t_mode = ED_IO;
	return 0;
}